

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O2

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options *opt)

{
  long lVar1;
  type_conflict6 tVar2;
  ostream *poVar3;
  invalid_argument *this;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *beta_00;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_R9;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  undefined1 local_c18 [160];
  uint local_b78 [2];
  uint auStack_b70 [2];
  uint local_b68 [2];
  uint auStack_b60 [2];
  uint local_b58 [2];
  uint auStack_b50 [2];
  uint local_b48 [2];
  uint auStack_b40 [2];
  int local_b38;
  bool local_b34;
  fpclass_type local_b30;
  int32_t iStack_b2c;
  real_t Tmin;
  real_t dT;
  cpp_dec_float<100U,_int,_void> local_a88;
  real_t Tmax;
  root_type local_9e0;
  root_type local_990;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_940;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_8f0;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_2UL>
  beta;
  array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
  local_7b0;
  free_energy local_6c0 [240];
  array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
  local_5d0;
  free_energy local_4e0 [240];
  array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
  local_3f0;
  array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
  local_300;
  array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
  local_210;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  f;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Ja,&opt->Ja);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jb,&opt->Jb);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jc,&opt->Jc);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Tmin,&opt->Tmin);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Tmax,&opt->Tmax);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&dT,&opt->dT);
  tVar2 = boost::multiprecision::operator>(&Tmin.base,&Tmax.base);
  if (tVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  else {
    beta.v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
    tVar2 = boost::multiprecision::operator<=(&dT.base,(int *)&beta);
    lVar1 = std::cout;
    if (!tVar2) {
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 0x100;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 100;
      poVar3 = std::operator<<((ostream *)&std::cout,"# lattice: triangular\n");
      poVar3 = std::operator<<(poVar3,"# precision: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<(poVar3,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n");
      local_a88.data._M_elems[0xc] = Tmin.base.m_backend.data._M_elems[0xc];
      local_a88.data._M_elems[0xd] = Tmin.base.m_backend.data._M_elems[0xd];
      local_a88.data._M_elems[0xe] = Tmin.base.m_backend.data._M_elems[0xe];
      local_a88.data._M_elems[0xf] = Tmin.base.m_backend.data._M_elems[0xf];
      local_a88.data._M_elems[8] = Tmin.base.m_backend.data._M_elems[8];
      local_a88.data._M_elems[9] = Tmin.base.m_backend.data._M_elems[9];
      local_a88.data._M_elems[10] = Tmin.base.m_backend.data._M_elems[10];
      local_a88.data._M_elems[0xb] = Tmin.base.m_backend.data._M_elems[0xb];
      local_a88.data._M_elems[4] = Tmin.base.m_backend.data._M_elems[4];
      local_a88.data._M_elems[5] = Tmin.base.m_backend.data._M_elems[5];
      local_a88.data._M_elems[6] = Tmin.base.m_backend.data._M_elems[6];
      local_a88.data._M_elems[7] = Tmin.base.m_backend.data._M_elems[7];
      local_a88.data._M_elems[0] = Tmin.base.m_backend.data._M_elems[0];
      local_a88.data._M_elems[1] = Tmin.base.m_backend.data._M_elems[1];
      local_a88.data._M_elems[2] = Tmin.base.m_backend.data._M_elems[2];
      local_a88.data._M_elems[3] = Tmin.base.m_backend.data._M_elems[3];
      local_a88.exp = Tmin.base.m_backend.exp;
      local_a88.neg = Tmin.base.m_backend.neg;
      local_a88.fpclass = Tmin.base.m_backend.fpclass;
      local_a88.prec_elem = Tmin.base.m_backend.prec_elem;
      while( true ) {
        operator*(f.v._M_elems,0.0001,&dT);
        operator+(beta.v._M_elems,&Tmax,f.v._M_elems);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                            *)&local_a88,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                            *)&beta.v);
        if (!tVar2) break;
        operator/(f.v._M_elems,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_a88);
        boost::math::differentiation::autodiff_v1::
        make_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                  ((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_2UL>
                    *)&beta.v,f.v._M_elems);
        local_b78[0] = Ja.base.m_backend.data._M_elems[0];
        local_b78[1] = Ja.base.m_backend.data._M_elems[1];
        auStack_b70[0] = Ja.base.m_backend.data._M_elems[2];
        auStack_b70[1] = Ja.base.m_backend.data._M_elems[3];
        local_b68[0] = Ja.base.m_backend.data._M_elems[4];
        local_b68[1] = Ja.base.m_backend.data._M_elems[5];
        auStack_b60[0] = Ja.base.m_backend.data._M_elems[6];
        auStack_b60[1] = Ja.base.m_backend.data._M_elems[7];
        local_b58[0] = Ja.base.m_backend.data._M_elems[8];
        local_b58[1] = Ja.base.m_backend.data._M_elems[9];
        auStack_b50[0] = Ja.base.m_backend.data._M_elems[10];
        auStack_b50[1] = Ja.base.m_backend.data._M_elems[0xb];
        local_b48[0] = Ja.base.m_backend.data._M_elems[0xc];
        local_b48[1] = Ja.base.m_backend.data._M_elems[0xd];
        auStack_b40[0] = Ja.base.m_backend.data._M_elems[0xe];
        auStack_b40[1] = Ja.base.m_backend.data._M_elems[0xf];
        local_b38 = Ja.base.m_backend.exp;
        local_b34 = Ja.base.m_backend.neg;
        local_b30 = Ja.base.m_backend.fpclass;
        iStack_b2c = Ja.base.m_backend.prec_elem;
        local_c18._80_4_ = Jb.base.m_backend.data._M_elems[0];
        local_c18._84_4_ = Jb.base.m_backend.data._M_elems[1];
        local_c18._88_4_ = Jb.base.m_backend.data._M_elems[2];
        local_c18._92_4_ = Jb.base.m_backend.data._M_elems[3];
        local_c18._96_4_ = Jb.base.m_backend.data._M_elems[4];
        local_c18._100_4_ = Jb.base.m_backend.data._M_elems[5];
        local_c18._104_4_ = Jb.base.m_backend.data._M_elems[6];
        local_c18._108_4_ = Jb.base.m_backend.data._M_elems[7];
        local_c18._112_4_ = Jb.base.m_backend.data._M_elems[8];
        local_c18._116_4_ = Jb.base.m_backend.data._M_elems[9];
        local_c18._120_4_ = Jb.base.m_backend.data._M_elems[10];
        local_c18._124_4_ = Jb.base.m_backend.data._M_elems[0xb];
        local_c18._128_4_ = Jb.base.m_backend.data._M_elems[0xc];
        local_c18._132_4_ = Jb.base.m_backend.data._M_elems[0xd];
        local_c18._136_4_ = Jb.base.m_backend.data._M_elems[0xe];
        local_c18._140_4_ = Jb.base.m_backend.data._M_elems[0xf];
        local_c18._144_4_ = Jb.base.m_backend.exp;
        local_c18[0x94] = Jb.base.m_backend.neg;
        local_c18._152_4_ = Jb.base.m_backend.fpclass;
        local_c18._156_4_ = Jb.base.m_backend.prec_elem;
        local_c18._0_4_ = Jc.base.m_backend.data._M_elems[0];
        local_c18._4_4_ = Jc.base.m_backend.data._M_elems[1];
        local_c18._8_4_ = Jc.base.m_backend.data._M_elems[2];
        local_c18._12_4_ = Jc.base.m_backend.data._M_elems[3];
        local_c18._16_4_ = Jc.base.m_backend.data._M_elems[4];
        local_c18._20_4_ = Jc.base.m_backend.data._M_elems[5];
        local_c18._24_4_ = Jc.base.m_backend.data._M_elems[6];
        local_c18._28_4_ = Jc.base.m_backend.data._M_elems[7];
        local_c18._32_4_ = Jc.base.m_backend.data._M_elems[8];
        local_c18._36_4_ = Jc.base.m_backend.data._M_elems[9];
        local_c18._40_4_ = Jc.base.m_backend.data._M_elems[10];
        local_c18._44_4_ = Jc.base.m_backend.data._M_elems[0xb];
        local_c18._48_4_ = Jc.base.m_backend.data._M_elems[0xc];
        local_c18._52_4_ = Jc.base.m_backend.data._M_elems[0xd];
        local_c18._56_4_ = Jc.base.m_backend.data._M_elems[0xe];
        local_c18._60_4_ = Jc.base.m_backend.data._M_elems[0xf];
        local_c18._64_4_ = Jc.base.m_backend.exp;
        local_c18[0x44] = Jc.base.m_backend.neg;
        local_c18._72_4_ = Jc.base.m_backend.fpclass;
        local_c18._76_4_ = Jc.base.m_backend.prec_elem;
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array(&local_210,&beta.v);
        beta_00 = (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                   *)local_c18;
        ising::free_energy::triangular::
        infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                  ((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)&f.v,(triangular *)local_b78,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)(local_c18 + 0x50),
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)beta_00,local_210._M_elems,in_R9);
        poVar3 = std::operator<<((ostream *)&std::cout,"inf inf ");
        poVar3 = boost::multiprecision::operator<<(poVar3,&Ja.base);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = boost::multiprecision::operator<<(poVar3,&Jb.base);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = boost::multiprecision::operator<<(poVar3,&Jc.base);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = boost::multiprecision::operator<<
                           (poVar3,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                    *)&local_a88);
        poVar3 = std::operator<<(poVar3,' ');
        operator/(&local_8f0,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_a88);
        poVar3 = boost::multiprecision::operator<<(poVar3,&local_8f0.base);
        poVar3 = std::operator<<(poVar3,' ');
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array(&local_300,&f.v);
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array(&local_3f0,&beta.v);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
        ::derivative<int>(&local_940,
                          (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                           *)&local_300,0);
        poVar3 = boost::multiprecision::operator<<(poVar3,&local_940.base);
        poVar3 = std::operator<<(poVar3,' ');
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array((array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
                 *)local_4e0,&f.v);
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array(&local_5d0,&beta.v);
        ising::free_energy::
        energy<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                  (&local_990,local_4e0,
                   (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)&local_5d0,beta_00);
        poVar3 = boost::multiprecision::operator<<(poVar3,&local_990.base);
        poVar3 = std::operator<<(poVar3,' ');
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array((array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
                 *)local_6c0,&f.v);
        std::
        array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_3UL>
        ::array(&local_7b0,&beta.v);
        ising::free_energy::
        specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                  (&local_9e0,local_6c0,
                   (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)&local_7b0,beta_00);
        poVar3 = boost::multiprecision::operator<<(poVar3,&local_9e0.base);
        std::endl<char,std::char_traits<char>>(poVar3);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_a88,(cpp_dec_float<100U,_int,_void> *)&dT);
      }
      return;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}